

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O1

void Lpk_ManStop(Lpk_Man_t *p)

{
  uint *__ptr;
  Vec_Int_t *pVVar1;
  void *pvVar2;
  If_Man_t *p_00;
  If_Par_t *__ptr_00;
  Vec_Vec_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  __ptr = p->ppTruths[0][0];
  if (__ptr != (uint *)0x0) {
    free(__ptr);
    p->ppTruths[0][0] = (uint *)0x0;
  }
  pVVar1 = p->vBddDir;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vBddInv;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vMemory;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  Kit_DsdManFree(p->pDsdMan);
  lVar5 = 0x3689;
  do {
    pvVar2 = *(void **)(p->pCuts[0].uSign + lVar5 * 2 + -0xb);
    if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar2 + 8));
      *(undefined8 *)((long)pvVar2 + 8) = 0;
    }
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x3691);
  p_00 = p->pIfMan;
  if (p_00 != (If_Man_t *)0x0) {
    __ptr_00 = p_00->pPars;
    If_ManStop(p_00);
    if (__ptr_00 != (If_Par_t *)0x0) {
      free(__ptr_00);
    }
  }
  pVVar3 = p->vLevels;
  if (pVVar3 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        pvVar2 = pVVar3->pArray[lVar5];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  pVVar3 = p->vVisited;
  if (pVVar3 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        pvVar2 = pVVar3->pArray[lVar5];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  pVVar4 = p->vLeaves;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar1 = p->vCover;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar4 = p->vTtElems;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vTtNodes;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  if (p != (Lpk_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Lpk_ManStop( Lpk_Man_t * p )
{
    int i;
    ABC_FREE( p->ppTruths[0][0] );
    Vec_IntFree( p->vBddDir );
    Vec_IntFree( p->vBddInv );
    Vec_IntFree( p->vMemory );
    Kit_DsdManFree( p->pDsdMan );
    for ( i = 0; i < 8; i++ )
        Vec_IntFree(p->vSets[i]);
    if ( p->pIfMan )
    {
        void * pPars = p->pIfMan->pPars;
        If_ManStop( p->pIfMan );
        ABC_FREE( pPars );
    }
    if ( p->vLevels )
        Vec_VecFree( p->vLevels );
    if ( p->vVisited )
        Vec_VecFree( p->vVisited );
    Vec_PtrFree( p->vLeaves );
    Vec_IntFree( p->vCover );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}